

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

bool relaxedMaComma(char **p)

{
  bool bVar1;
  char *pcVar2;
  
  SkipBlanks(p);
  pcVar2 = *p;
  if (*pcVar2 == ',') {
    if (pcVar2[1] == ',') {
      if (DAT_0018a520 == comma) goto LAB_00120019;
      pcVar2 = pcVar2 + 2;
    }
    else {
      pcVar2 = pcVar2 + 1;
    }
    *p = pcVar2;
    bVar1 = true;
  }
  else {
LAB_00120019:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool relaxedMaComma(char* & p) {
	SkipBlanks(p);
	if (',' != p[0]) return false;		// no comma
	if (',' == p[1]) {
		// double comma detected, accept it only in --syntax=a mode
		if (Options::syx.isMultiArgPlainComma()) return false;
		p += 2;
		return true;
	}
	// single comma is enough in relaxed way, even in --syntax=a mode
	++p;
	return true;
}